

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O1

int WebPRescalerGetScaledDimensions
              (int src_width,int src_height,int *scaled_width,int *scaled_height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = *scaled_width;
  iVar3 = *scaled_height;
  if (0 < src_height && iVar2 == 0) {
    iVar2 = (int)((((ulong)(uint)src_height + (long)src_width * (long)iVar3) - 1) /
                 (ulong)(uint)src_height);
  }
  if (0 < src_width && iVar3 == 0) {
    iVar3 = (int)((((ulong)(uint)src_width + (long)iVar2 * (long)src_height) - 1) /
                 (ulong)(uint)src_width);
  }
  iVar1 = 0;
  if ((0xc0000000 < iVar2 + 0xc0000000U) && (0xc0000000 < iVar3 + 0xc0000000U)) {
    *scaled_width = iVar2;
    *scaled_height = iVar3;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int WebPRescalerGetScaledDimensions(int src_width, int src_height,
                                    int* const scaled_width,
                                    int* const scaled_height) {
  assert(scaled_width != NULL);
  assert(scaled_height != NULL);
  {
    int width = *scaled_width;
    int height = *scaled_height;
    const int max_size = INT_MAX / 2;

    // if width is unspecified, scale original proportionally to height ratio.
    if (width == 0 && src_height > 0) {
      width =
          (int)(((uint64_t)src_width * height + src_height - 1) / src_height);
    }
    // if height is unspecified, scale original proportionally to width ratio.
    if (height == 0 && src_width > 0) {
      height =
          (int)(((uint64_t)src_height * width + src_width - 1) / src_width);
    }
    // Check if the overall dimensions still make sense.
    if (width <= 0 || height <= 0 || width > max_size || height > max_size) {
      return 0;
    }

    *scaled_width = width;
    *scaled_height = height;
    return 1;
  }
}